

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O2

void __thiscall
hta::detail::
make_exception<const_char_*,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_const_char_*,_hta::Clock::time_point,_const_char_*,_hta::Clock::time_point>
::operator()(make_exception<const_char_*,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_const_char_*,_hta::Clock::time_point,_const_char_*,_hta::Clock::time_point>
             *this,stringstream *msg,char *arg,duration<long,_std::ratio<1L,_1000000000L>_> args,
            char *args_1,time_point args_2,char *args_3,time_point args_4)

{
  make_exception<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_const_char_*,_hta::Clock::time_point,_const_char_*,_hta::Clock::time_point>
  local_31;
  
  std::operator<<((ostream *)(msg + 0x10),arg);
  make_exception<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_const_char_*,_hta::Clock::time_point,_const_char_*,_hta::Clock::time_point>
  ::operator()(&local_31,msg,args,args_1,args_2,args_3,args_4);
  return;
}

Assistant:

void operator()(std::stringstream& msg, Arg arg, Args... args)
        {
            msg << arg;
            make_exception<Args...>()(msg, args...);
        }